

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O1

void av1_highbd_convolve_2d_scale_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  int iVar2;
  int16_t *piVar3;
  short sVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  uint16_t *puVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint16_t *puVar20;
  uint16_t *puVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  uint16_t uVar25;
  undefined2 *__s;
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  short sVar34;
  int iVar35;
  short sVar37;
  int iVar38;
  int iVar39;
  undefined1 in_XMM9 [16];
  undefined1 auVar36 [16];
  int iVar40;
  short sVar41;
  undefined1 in_XMM10 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int16_t tmp [34304];
  ulong uStack_10cc8;
  ulong uStack_10cc0;
  uint16_t *puStack_10cb0;
  uint uStack_10ca0;
  undefined2 auStack_10c38 [34308];
  
  uVar1 = filter_params_y->taps;
  uVar18 = ((h + -1) * y_step_qn + subpel_y_qn >> 10) + (uint)uVar1;
  __s = auStack_10c38;
  memset(__s,0,0x10c00);
  iVar2 = conv_params->round_0;
  bVar6 = (byte)iVar2;
  iVar5 = 1 << (bVar6 & 0x1f);
  uVar19 = 1 << ((char)bd + 6U & 0x1f);
  lVar11 = (long)(int)uVar18;
  if (0 < w) {
    iVar16 = ((uVar1 >> 1) - 1) * src_stride;
    iVar22 = iVar5 / 2 + uVar19;
    auVar27 = ZEXT416((uint)conv_params->round_0);
    lVar23 = (long)src_stride;
    piVar3 = filter_params_x->filter_ptr;
    uVar1 = filter_params_x->taps;
    uStack_10cc8 = 0;
    do {
      uVar17 = (uint)subpel_x_qn >> 6 & 0xf;
      uVar12 = 0;
      if (3 < (int)uVar18) {
        uStack_10ca0 = (uint)uVar1;
        auVar28 = *(undefined1 (*) [16])(piVar3 + uVar17 * uStack_10ca0);
        puVar20 = src + ((long)(subpel_x_qn >> 10) - (long)iVar16);
        uVar12 = 0;
        do {
          auVar29 = pmaddwd(*(undefined1 (*) [16])(puVar20 + -3),auVar28);
          in_XMM5 = pmaddwd(*(undefined1 (*) [16])(puVar20 + lVar23 + -3),auVar28);
          auVar29 = phaddd(auVar29,in_XMM5);
          auVar31 = pmaddwd(*(undefined1 (*) [16])(puVar20 + (long)(src_stride * 2) + -3),auVar28);
          auVar32 = pmaddwd(*(undefined1 (*) [16])(puVar20 + (long)(src_stride * 3) + -3),auVar28);
          auVar31 = phaddd(auVar31,auVar32);
          auVar29 = phaddd(auVar29,auVar31);
          auVar31._0_4_ = auVar29._0_4_ + iVar22 >> auVar27;
          auVar31._4_4_ = auVar29._4_4_ + iVar22 >> auVar27;
          auVar31._8_4_ = auVar29._8_4_ + iVar22 >> auVar27;
          auVar31._12_4_ = auVar29._12_4_ + iVar22 >> auVar27;
          in_XMM4 = packusdw(auVar31,auVar31);
          *(long *)(__s + uVar12) = in_XMM4._0_8_;
          uVar12 = uVar12 + 4;
          puVar20 = puVar20 + lVar23 * 4;
        } while ((long)uVar12 <= (long)(int)(uVar18 - 4));
      }
      if ((int)uVar12 < (int)uVar18) {
        uVar12 = uVar12 & 0xffffffff;
        lVar24 = (long)src +
                 lVar23 * 2 * uVar12 + (long)(subpel_x_qn >> 10) * 2 + (long)iVar16 * -2 + -6;
        do {
          lVar13 = 0;
          auVar28 = ZEXT416(uVar19);
          do {
            in_XMM4 = pmovsxwd(in_XMM4,*(undefined8 *)
                                        ((long)piVar3 +
                                        lVar13 * 2 +
                                        (ulong)uVar17 * (ulong)((uint)uVar1 + (uint)uVar1)));
            auVar29 = pmovzxwd(in_XMM5,*(undefined8 *)(lVar24 + lVar13 * 2));
            in_XMM5 = pmulld(auVar29,in_XMM4);
            auVar29._0_4_ = auVar28._0_4_ + in_XMM5._0_4_;
            auVar29._4_4_ = auVar28._4_4_ + in_XMM5._4_4_;
            auVar29._8_4_ = auVar28._8_4_ + in_XMM5._8_4_;
            auVar29._12_4_ = auVar28._12_4_ + in_XMM5._12_4_;
            lVar13 = lVar13 + 4;
            auVar28 = auVar29;
          } while (lVar13 != 8);
          auVar28 = phaddd(auVar29,auVar29);
          auVar28 = phaddd(auVar28,auVar28);
          auStack_10c38[uStack_10cc8 * lVar11 + uVar12] =
               (short)(auVar28._0_4_ + (iVar5 >> 1) >> (bVar6 & 0x1f));
          uVar12 = uVar12 + 1;
          lVar24 = lVar24 + lVar23 * 2;
        } while (uVar12 != uVar18);
      }
      uStack_10cc8 = uStack_10cc8 + 1;
      subpel_x_qn = subpel_x_qn + x_step_qn;
      __s = __s + lVar11;
    } while (uStack_10cc8 != (uint)w);
  }
  bVar6 = ((char)bd - bVar6) + 0xe;
  uVar19 = 0xff;
  if (bd == 0xc) {
    uVar19 = 0xfff;
  }
  if (bd == 10) {
    uVar19 = 0x3ff;
  }
  uVar17 = 0xe - (iVar2 + conv_params->round_1);
  bVar7 = (byte)uVar17;
  uVar26 = 1 << (bVar6 & 0x1f);
  if (0 < h) {
    auVar27 = ZEXT416((uint)conv_params->round_1);
    puVar20 = conv_params->dst;
    auVar28 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0);
    auVar29 = ZEXT416(uVar17);
    iVar22 = (1 << (bVar7 & 0x1f)) >> 1;
    iVar2 = conv_params->fwd_offset;
    auVar32._4_4_ = iVar2;
    auVar32._0_4_ = iVar2;
    auVar32._8_4_ = iVar2;
    auVar32._12_4_ = iVar2;
    iVar2 = conv_params->bck_offset;
    auVar30._4_4_ = iVar2;
    auVar30._0_4_ = iVar2;
    auVar30._8_4_ = iVar2;
    auVar30._12_4_ = iVar2;
    bVar8 = (byte)conv_params->round_1;
    bVar9 = bVar6 - bVar8;
    iVar2 = conv_params->dst_stride;
    iVar5 = ((1 << (bVar8 & 0x1f)) >> 1) + uVar26;
    iVar16 = (-1 << (bVar9 & 0x1f)) + iVar22 + (-1 << (bVar9 - 1 & 0x1f));
    uStack_10cc0 = 0;
    puStack_10cb0 = puVar20;
    do {
      uVar19 = (uint)subpel_y_qn >> 6 & 0xf;
      uVar1 = filter_params_y->taps;
      piVar3 = filter_params_y->filter_ptr;
      uVar12 = 0;
      if (3 < w) {
        pauVar14 = (undefined1 (*) [16])(auStack_10c38 + (subpel_y_qn >> 10));
        auVar31 = *(undefined1 (*) [16])(piVar3 + uVar19 * uVar1);
        uVar12 = 0;
        puVar21 = puStack_10cb0;
        do {
          auVar36 = pmaddwd(*pauVar14,auVar31);
          auVar42 = pmaddwd(*(undefined1 (*) [16])(*pauVar14 + lVar11 * 2),auVar31);
          auVar36 = phaddd(auVar36,auVar42);
          auVar42 = pmaddwd(*(undefined1 (*) [16])(*pauVar14 + (long)(int)(uVar18 * 2) * 2),auVar31)
          ;
          auVar43 = pmaddwd(*(undefined1 (*) [16])(*pauVar14 + (long)(int)(uVar18 * 3) * 2),auVar31)
          ;
          in_XMM10 = phaddd(auVar42,auVar43);
          auVar36 = phaddd(auVar36,in_XMM10);
          auVar42._0_4_ = auVar36._0_4_ + iVar5 >> auVar27;
          auVar42._4_4_ = auVar36._4_4_ + iVar5 >> auVar27;
          auVar42._8_4_ = auVar36._8_4_ + iVar5 >> auVar27;
          auVar42._12_4_ = auVar36._12_4_ + iVar5 >> auVar27;
          if (conv_params->is_compound == 0) {
            auVar36._0_4_ = auVar42._0_4_ + iVar16;
            auVar36._4_4_ = auVar42._4_4_ + iVar16;
            auVar36._8_4_ = auVar42._8_4_ + iVar16;
            auVar36._12_4_ = auVar42._12_4_ + iVar16;
            auVar43 = psraw(auVar36,auVar29);
LAB_003f85f4:
            auVar36 = packusdw(auVar43,auVar43);
            sVar4 = auVar28._0_2_;
            sVar34 = auVar36._0_2_;
            in_XMM9._0_2_ = (ushort)(sVar4 < sVar34) * sVar4 | (ushort)(sVar4 >= sVar34) * sVar34;
            sVar34 = auVar28._2_2_;
            sVar37 = auVar36._2_2_;
            in_XMM9._2_2_ = (ushort)(sVar34 < sVar37) * sVar34 | (ushort)(sVar34 >= sVar37) * sVar37
            ;
            sVar37 = auVar36._4_2_;
            in_XMM9._4_2_ = (ushort)(sVar4 < sVar37) * sVar4 | (ushort)(sVar4 >= sVar37) * sVar37;
            sVar37 = auVar36._6_2_;
            in_XMM9._6_2_ = (ushort)(sVar34 < sVar37) * sVar34 | (ushort)(sVar34 >= sVar37) * sVar37
            ;
            sVar37 = auVar36._8_2_;
            in_XMM9._8_2_ = (ushort)(sVar4 < sVar37) * sVar4 | (ushort)(sVar4 >= sVar37) * sVar37;
            sVar37 = auVar36._10_2_;
            in_XMM9._10_2_ =
                 (ushort)(sVar34 < sVar37) * sVar34 | (ushort)(sVar34 >= sVar37) * sVar37;
            sVar37 = auVar36._12_2_;
            sVar41 = auVar36._14_2_;
            in_XMM9._12_2_ = (ushort)(sVar4 < sVar37) * sVar4 | (ushort)(sVar4 >= sVar37) * sVar37;
            in_XMM9._14_2_ =
                 (ushort)(sVar34 < sVar41) * sVar34 | (ushort)(sVar34 >= sVar41) * sVar41;
            puVar15 = dst + uStack_10cc0 * (long)dst_stride + uVar12;
          }
          else {
            if (conv_params->do_average != 0) {
              in_XMM10 = pmovzxwd(in_XMM10,*(undefined8 *)puVar21);
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                iVar35 = auVar42._0_4_ + in_XMM10._0_4_ >> 1;
                iVar38 = auVar42._4_4_ + in_XMM10._4_4_ >> 1;
                iVar39 = auVar42._8_4_ + in_XMM10._8_4_ >> 1;
                iVar40 = auVar42._12_4_ + in_XMM10._12_4_ >> 1;
              }
              else {
                in_XMM10 = pmulld(in_XMM10,auVar32);
                auVar36 = pmulld(auVar42,auVar30);
                iVar35 = auVar36._0_4_ + in_XMM10._0_4_ >> 4;
                iVar38 = auVar36._4_4_ + in_XMM10._4_4_ >> 4;
                iVar39 = auVar36._8_4_ + in_XMM10._8_4_ >> 4;
                iVar40 = auVar36._12_4_ + in_XMM10._12_4_ >> 4;
              }
              auVar43._0_4_ = iVar35 + iVar16 >> auVar29;
              auVar43._4_4_ = iVar38 + iVar16 >> auVar29;
              auVar43._8_4_ = iVar39 + iVar16 >> auVar29;
              auVar43._12_4_ = iVar40 + iVar16 >> auVar29;
              goto LAB_003f85f4;
            }
            in_XMM9 = packusdw(auVar42,auVar42);
            puVar15 = puVar21;
          }
          *(long *)puVar15 = in_XMM9._0_8_;
          uVar12 = uVar12 + 4;
          puVar21 = puVar21 + 4;
          pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar11 * 8);
        } while ((long)uVar12 <= (long)(w + -4));
      }
      if ((int)uVar12 < w) {
        bVar9 = (byte)conv_params->round_1;
        iVar35 = conv_params->is_compound;
        uVar12 = uVar12 & 0xffffffff;
        puVar21 = puVar20 + uStack_10cc0 * (long)iVar2;
        lVar23 = (long)auStack_10c38 + lVar11 * 2 * uVar12 + (long)(subpel_y_qn >> 10) * 2;
        do {
          lVar24 = 0;
          auVar31 = ZEXT416(uVar26);
          do {
            in_XMM9 = pmovzxwd(in_XMM9,*(undefined8 *)
                                        ((long)piVar3 +
                                        lVar24 * 2 + (ulong)((uint)uVar1 * 2) * (ulong)uVar19));
            auVar36 = pmovzxwd(in_XMM10,*(undefined8 *)(lVar23 + lVar24 * 2));
            in_XMM10 = pmaddwd(auVar36,in_XMM9);
            auVar33._0_4_ = auVar31._0_4_ + in_XMM10._0_4_;
            auVar33._4_4_ = auVar31._4_4_ + in_XMM10._4_4_;
            auVar33._8_4_ = auVar31._8_4_ + in_XMM10._8_4_;
            auVar33._12_4_ = auVar31._12_4_ + in_XMM10._12_4_;
            lVar24 = lVar24 + 4;
            auVar31 = auVar33;
          } while (lVar24 != 8);
          auVar31 = phaddd(auVar33,auVar33);
          auVar31 = phaddd(auVar31,auVar31);
          uVar17 = auVar31._0_4_ + ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f);
          uVar25 = (uint16_t)uVar17;
          if (iVar35 == 0) {
            uVar17 = uVar17 & 0xffff;
LAB_003f8739:
            iVar38 = (int)(uVar17 + (-1 << (bVar6 - bVar9 & 0x1f)) + iVar22 +
                                    (-1 << ((bVar6 - bVar9) - 1 & 0x1f))) >> (bVar7 & 0x1f);
            if (bd == 10) {
              iVar39 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar39 = 0xfff;
            }
            else {
              iVar39 = 0xff;
            }
            if (iVar39 <= iVar38) {
              iVar38 = iVar39;
            }
            if (iVar38 < 1) {
              iVar38 = 0;
            }
            uVar25 = (uint16_t)iVar38;
            puVar15 = dst + uStack_10cc0 * (long)dst_stride;
          }
          else {
            puVar15 = puVar21;
            if (conv_params->do_average != 0) {
              uVar10 = (uint)puVar21[uVar12];
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                uVar17 = (uVar17 & 0xffff) + uVar10 >> 1;
              }
              else {
                uVar17 = (int)((uVar17 & 0xffff) * conv_params->bck_offset +
                              uVar10 * conv_params->fwd_offset) >> 4;
              }
              goto LAB_003f8739;
            }
          }
          puVar15[uVar12] = uVar25;
          uVar12 = uVar12 + 1;
          lVar23 = lVar23 + lVar11 * 2;
        } while (uVar12 != (uint)w);
      }
      uStack_10cc0 = uStack_10cc0 + 1;
      subpel_y_qn = subpel_y_qn + y_step_qn;
      puStack_10cb0 = puStack_10cb0 + iVar2;
    } while (uStack_10cc0 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_scale_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int x_step_qn, const int subpel_y_qn, const int y_step_qn,
    ConvolveParams *conv_params, int bd) {
  // TODO(yaowu): Move this out of stack
  DECLARE_ALIGNED(16, int16_t,
                  tmp[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE]);
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  const int xtaps = filter_params_x->taps;
  const int ytaps = filter_params_y->taps;
  const int fo_vert = ytaps / 2 - 1;

  memset(tmp, 0, sizeof(tmp));
  assert((xtaps == 8) && (ytaps == 8));
  (void)xtaps;

  // horizontal filter
  highbd_hfilter8(src - fo_vert * src_stride, src_stride, tmp, w, im_h,
                  subpel_x_qn, x_step_qn, filter_params_x, conv_params->round_0,
                  bd);

  // vertical filter (input is transposed)
  highbd_vfilter8(tmp, im_h, dst, dst_stride, w, h, subpel_y_qn, y_step_qn,
                  filter_params_y, conv_params, bd);
}